

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue.hpp
# Opt level: O3

void libtorrent::heterogeneous_queue<libtorrent::alert>::move<libtorrent::dht_mutable_item_alert>
               (char *dst,char *src)

{
  dht_mutable_item_alert::dht_mutable_item_alert
            ((dht_mutable_item_alert *)dst,(dht_mutable_item_alert *)src);
  entry::~entry((entry *)(src + 0x98));
  if (*(long **)(src + 0x78) != (long *)(src + 0x88)) {
    operator_delete(*(long **)(src + 0x78),*(long *)(src + 0x88) + 1);
  }
  alert::~alert((alert *)src);
  return;
}

Assistant:

static void move(char* dst, char* src) noexcept
		{
			static_assert(std::is_nothrow_move_constructible<U>::value
				, "heterogeneous queue only supports noexcept move constructible types");
			static_assert(std::is_nothrow_destructible<U>::value
				, "heterogeneous queue only supports noexcept destructible types");
			U& rhs = *reinterpret_cast<U*>(src);

			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(dst) & (alignof(U) - 1)) == 0);

			new (dst) U(std::move(rhs));
			rhs.~U();
		}